

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

uint32 google::protobuf::compiler::cpp::ParseLoopGenerator::ExpectedTag
                 (FieldDescriptor *field,uint32 *fallback_tag_ptr)

{
  bool bVar1;
  uint32 uVar2;
  WireType WVar3;
  int iVar4;
  LogMessage *this;
  uint32 *in_RSI;
  FieldDescriptor *in_RDI;
  WireType expected_wiretype_1;
  uint32 fallback_tag;
  WireType fallback_wiretype;
  WireType expected_wiretype;
  uint32 expected_tag;
  FieldDescriptor *in_stack_ffffffffffffff78;
  LogMessage *other;
  LogMessage *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  LogLevel in_stack_ffffffffffffff8c;
  uint in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  LogMessage local_50;
  WireType local_18;
  uint32 local_14;
  uint32 *local_10;
  FieldDescriptor *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = FieldDescriptor::is_packable((FieldDescriptor *)in_stack_ffffffffffffff80);
  if (bVar1) {
    FieldDescriptor::type
              ((FieldDescriptor *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_18 = internal::WireFormat::WireTypeForFieldType(0);
    iVar4 = FieldDescriptor::number(local_8);
    local_14 = internal::WireFormatLite::MakeTag(iVar4,local_18);
    if (local_18 == WIRETYPE_LENGTH_DELIMITED) {
      other = &local_50;
      internal::LogMessage::LogMessage
                ((LogMessage *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c,(char *)in_stack_ffffffffffffff80,
                 (int)((ulong)other >> 0x20));
      this = internal::LogMessage::operator<<(in_stack_ffffffffffffff80,(char *)other);
      internal::LogFinisher::operator=((LogFinisher *)this,other);
      internal::LogMessage::~LogMessage((LogMessage *)0x43f00f);
    }
    WVar3 = WIRETYPE_LENGTH_DELIMITED;
    iVar4 = FieldDescriptor::number(local_8);
    uVar2 = internal::WireFormatLite::MakeTag(iVar4,WVar3);
    bVar1 = FieldDescriptor::is_packed
                      ((FieldDescriptor *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (bVar1) {
      std::swap<unsigned_int>(&local_14,(uint *)&stack0xffffffffffffff90);
    }
    *local_10 = uVar2;
  }
  else {
    WVar3 = internal::WireFormat::WireTypeForField(in_stack_ffffffffffffff78);
    iVar4 = FieldDescriptor::number(local_8);
    local_14 = internal::WireFormatLite::MakeTag(iVar4,WVar3);
  }
  return local_14;
}

Assistant:

static uint32 ExpectedTag(const FieldDescriptor* field,
                            uint32* fallback_tag_ptr) {
    uint32 expected_tag;
    if (field->is_packable()) {
      auto expected_wiretype = WireFormat::WireTypeForFieldType(field->type());
      expected_tag =
          WireFormatLite::MakeTag(field->number(), expected_wiretype);
      GOOGLE_CHECK(expected_wiretype != WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      auto fallback_wiretype = WireFormatLite::WIRETYPE_LENGTH_DELIMITED;
      uint32 fallback_tag =
          WireFormatLite::MakeTag(field->number(), fallback_wiretype);

      if (field->is_packed()) std::swap(expected_tag, fallback_tag);
      *fallback_tag_ptr = fallback_tag;
    } else {
      auto expected_wiretype = WireFormat::WireTypeForField(field);
      expected_tag =
          WireFormatLite::MakeTag(field->number(), expected_wiretype);
    }
    return expected_tag;
  }